

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O2

void __thiscall
cppcms::applications_pool::applications_pool(applications_pool *this,service *srv,int param_2)

{
  int iVar1;
  _data *this_00;
  
  this->srv_ = srv;
  this_00 = (_data *)operator_new(0x60);
  (this_00->apps).
  super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (this_00->apps).
  super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (this_00->apps).
  super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
  ._M_impl._M_node._M_size = 0;
  (this_00->legacy_async_apps).
  super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (this_00->legacy_async_apps).
  super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (this_00->legacy_async_apps).
  super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)&this_00->thread_count = 0;
  (this_00->lock).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this_00->lock).super___recursive_mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this_00->lock).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this_00->lock).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this_00->lock).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  _data::_data(this_00);
  (this->d).ptr_ = this_00;
  iVar1 = service::threads_no(this->srv_);
  ((this->d).ptr_)->thread_count = iVar1;
  return;
}

Assistant:

applications_pool::applications_pool(service &srv,int /*unused*/) :
	srv_(&srv),
	d(new applications_pool::_data())
{
	d->thread_count = srv_->threads_no();
}